

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# velocypack-wyhash.h
# Opt level: O0

uint64_t wyhash(void *key,size_t len,uint64_t seed,uint64_t *secret)

{
  ulong B;
  uint64_t uVar1;
  long in_RCX;
  ulong in_RSI;
  uint8_t *in_RDI;
  uint64_t see2;
  uint64_t see1;
  size_t i;
  uint64_t b;
  uint64_t a;
  uint8_t *p;
  uint64_t in_stack_ffffffffffffff78;
  ulong in_stack_ffffffffffffff80;
  ulong local_40;
  uint8_t *local_28;
  
  if (in_RSI < 0x11) {
    if (in_RSI < 4) {
      if (in_RSI != 0) {
        _wyr3(in_RDI,in_RSI);
      }
    }
    else {
      _wyr4(in_RDI);
      _wyr4(in_RDI + (in_RSI >> 3) * 4);
      _wyr4(in_RDI + (in_RSI - 4));
      _wyr4(in_RDI + (in_RSI >> 3) * -4 + (in_RSI - 4));
    }
  }
  else {
    local_40 = in_RSI;
    local_28 = in_RDI;
    if (0x30 < in_RSI) {
      do {
        _wyr8(local_28);
        _wyr8(local_28 + 8);
        _wymix(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        _wyr8(local_28 + 0x10);
        _wyr8(local_28 + 0x18);
        _wymix(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        _wyr8(local_28 + 0x20);
        _wyr8(local_28 + 0x28);
        _wymix(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        local_28 = local_28 + 0x30;
        local_40 = local_40 - 0x30;
      } while (0x30 < local_40);
    }
    for (; 0x10 < local_40; local_40 = local_40 - 0x10) {
      uVar1 = _wyr8(local_28);
      in_stack_ffffffffffffff80 = uVar1 ^ *(ulong *)(in_RCX + 8);
      _wyr8(local_28 + 8);
      _wymix(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      local_28 = local_28 + 0x10;
    }
    _wyr8(local_28 + (local_40 - 0x10));
    _wyr8(local_28 + (local_40 - 8));
  }
  B = *(ulong *)(in_RCX + 8) ^ in_RSI;
  _wymix(in_stack_ffffffffffffff80,B);
  uVar1 = _wymix(in_stack_ffffffffffffff80,B);
  return uVar1;
}

Assistant:

static inline uint64_t wyhash(const void* key, size_t len, uint64_t seed,
                              const uint64_t* secret) {
  const uint8_t* p = (const uint8_t*)key;
  seed ^= *secret;
  uint64_t a, b;
  if (_likely_(len <= 16)) {
    if (_likely_(len >= 4)) {
      a = (_wyr4(p) << 32) | _wyr4(p + ((len >> 3) << 2));
      b = (_wyr4(p + len - 4) << 32) | _wyr4(p + len - 4 - ((len >> 3) << 2));
    } else if (_likely_(len > 0)) {
      a = _wyr3(p, len);
      b = 0;
    } else
      a = b = 0;
  } else {
    size_t i = len;
    if (_unlikely_(i > 48)) {
      uint64_t see1 = seed, see2 = seed;
      do {
        seed = _wymix(_wyr8(p) ^ secret[1], _wyr8(p + 8) ^ seed);
        see1 = _wymix(_wyr8(p + 16) ^ secret[2], _wyr8(p + 24) ^ see1);
        see2 = _wymix(_wyr8(p + 32) ^ secret[3], _wyr8(p + 40) ^ see2);
        p += 48;
        i -= 48;
      } while (_likely_(i > 48));
      seed ^= see1 ^ see2;
    }
    while (_unlikely_(i > 16)) {
      seed = _wymix(_wyr8(p) ^ secret[1], _wyr8(p + 8) ^ seed);
      i -= 16;
      p += 16;
    }
    a = _wyr8(p + i - 16);
    b = _wyr8(p + i - 8);
  }
  return _wymix(secret[1] ^ len, _wymix(a ^ secret[1], b ^ seed));
}